

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.hpp
# Opt level: O0

void __thiscall helics::CallbackFederate::clearNextTimeCallback(CallbackFederate *this)

{
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  *in_RDI;
  nullptr_t in_stack_ffffffffffffffe8;
  
  std::
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  ::operator=(in_RDI,in_stack_ffffffffffffffe8);
  std::function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
  ::operator=((function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
               *)in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void clearNextTimeCallback()
    {
        nextTimeOperation1 = nullptr;
        nextTimeOperation2 = nullptr;
    }